

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_select_line_part_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Wrapper *value;
  undefined1 local_48 [8];
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object local_20;
  Am_Object script_line_part;
  Am_Object inter;
  Am_Object *cmd_local;
  
  pAVar1 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&script_line_part,pAVar1);
  pAVar1 = Am_Object::Get(cmd,0x16d,0);
  Am_Object::Am_Object(&local_20,pAVar1);
  Am_Object::Get_Owner((Am_Object *)&sel_list.item,(Am_Slot_Flags)&script_line_part);
  clear_all_line_same((Am_Object *)&sel_list.item);
  Am_Object::Set((Am_Object *)&sel_list.item,0x169,false,0);
  find_and_set_other_lines_with_same((Am_Object *)local_48,&local_20);
  value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_48);
  Am_Object::Set((Am_Object *)&sel_list.item,0x171,value,1);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&script_line_part);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_select_line_part, (Am_Object cmd))
{
  Am_Object inter = cmd.Get(Am_SAVED_OLD_OWNER);
  Am_Object script_line_part = cmd.Get(Am_OBJECT_MODIFIED);
  Am_Object scroll_menu = inter.Get_Owner();
  clear_all_line_same(scroll_menu);
  scroll_menu.Set(Am_VALUE, false);
  Am_Value_List sel_list =
      find_and_set_other_lines_with_same(script_line_part, scroll_menu);
  scroll_menu.Set(Am_SAVED_OLD_OBJECT_OWNER, sel_list, Am_OK_IF_NOT_THERE);
}